

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_39db::TlbExportVisitor::visit_(TlbExportVisitor *this,OpaqueType *type)

{
  ostream *poVar1;
  ulong uVar2;
  TlbExportVisitor local_a8 [32];
  TlbExportVisitor local_88 [48];
  string local_58 [32];
  anon_unknown_dwarf_39db local_38 [32];
  OpaqueType *local_18;
  OpaqueType *type_local;
  TlbExportVisitor *this_local;
  
  local_18 = type;
  type_local = (OpaqueType *)this;
  poVar1 = std::operator<<(this->m_stream,"<opaque name=\"");
  Typelib::Type::getName_abi_cxx11_();
  xmlEscape(local_38,local_58);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  poVar1 = std::operator<<(poVar1,"\" size=\"");
  uVar2 = Typelib::Type::getSize();
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  poVar1 = std::operator<<(poVar1,"\" ");
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_(local_88);
  poVar1 = std::operator<<(poVar1,(string *)local_88);
  std::operator<<(poVar1,">\n");
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_(local_a8,(Type *)this);
  poVar1 = std::operator<<(poVar1,(string *)local_a8);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)local_a8);
  poVar1 = std::operator<<(this->m_stream,(string *)&this->m_indent);
  std::operator<<(poVar1,"</opaque>");
  return true;
}

Assistant:

bool TlbExportVisitor::visit_(OpaqueType const& type)
    {
        m_stream << "<opaque name=\"" << xmlEscape(type.getName()) << "\" size=\"" << type.getSize() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</opaque>";
        return true;
    }